

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O0

GLenum deqp::gles31::Functional::anon_unknown_1::LayeredRenderCase::getTargetTextureTarget
                 (LayeredRenderTargetType target)

{
  GLenum local_c;
  LayeredRenderTargetType target_local;
  
  switch(target) {
  case TARGET_CUBE:
    local_c = 0x8513;
    break;
  case TARGET_3D:
    local_c = 0x806f;
    break;
  case TARGET_1D_ARRAY:
    local_c = 0x8c18;
    break;
  case TARGET_2D_ARRAY:
    local_c = 0x8c1a;
    break;
  case TARGET_2D_MS_ARRAY:
    local_c = 0x9102;
    break;
  default:
    local_c = 0;
  }
  return local_c;
}

Assistant:

glw::GLenum LayeredRenderCase::getTargetTextureTarget (LayeredRenderTargetType target)
{
	switch (target)
	{
		case TARGET_CUBE:			return GL_TEXTURE_CUBE_MAP;
		case TARGET_3D:				return GL_TEXTURE_3D;
		case TARGET_1D_ARRAY:		return GL_TEXTURE_1D_ARRAY;
		case TARGET_2D_ARRAY:		return GL_TEXTURE_2D_ARRAY;
		case TARGET_2D_MS_ARRAY:	return GL_TEXTURE_2D_MULTISAMPLE_ARRAY;
		default:
			DE_ASSERT(DE_FALSE);
			return 0;
	}
}